

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.h
# Opt level: O0

void __thiscall
cmTargetCompileFeaturesCommand::~cmTargetCompileFeaturesCommand
          (cmTargetCompileFeaturesCommand *this)

{
  cmTargetCompileFeaturesCommand *this_local;
  
  ~cmTargetCompileFeaturesCommand(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmTargetCompileFeaturesCommand;
    }